

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

mem_hash_record * MemHashGetEntry(mem_hash_kv_engine *pEngine,void *pKey,int nKeyLen)

{
  sxu32 sVar1;
  sxi32 sVar2;
  sxu32 nBucket;
  sxu32 nHash;
  mem_hash_record *pEntry;
  int nKeyLen_local;
  void *pKey_local;
  mem_hash_kv_engine *pEngine_local;
  
  sVar1 = (*pEngine->xHash)(pKey,nKeyLen);
  _nBucket = pEngine->apBucket[sVar1 & pEngine->nBucket - 1];
  while( true ) {
    if (_nBucket == (mem_hash_record *)0x0) {
      return (mem_hash_record *)0x0;
    }
    if (((_nBucket->nHash == sVar1) && (_nBucket->nKeyLen == nKeyLen)) &&
       (sVar2 = (*pEngine->xCmp)(_nBucket->pKey,pKey,_nBucket->nKeyLen), sVar2 == 0)) break;
    _nBucket = _nBucket->pNextHash;
  }
  return _nBucket;
}

Assistant:

static mem_hash_record * MemHashGetEntry(
	mem_hash_kv_engine *pEngine,
	const void *pKey,int nKeyLen
	)
{
	mem_hash_record *pEntry;
	sxu32 nHash,nBucket;
	/* Hash the entry */
	nHash = pEngine->xHash(pKey,(sxu32)nKeyLen);
	nBucket = nHash & (pEngine->nBucket - 1);
	pEntry = pEngine->apBucket[nBucket];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKeyLen == (sxu32)nKeyLen && 
			pEngine->xCmp(pEntry->pKey,pKey,pEntry->nKeyLen) == 0 ){
				return pEntry;
		}
		pEntry = pEntry->pNextHash;
	}
	/* No such entry */
	return 0;
}